

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

void __thiscall
JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
          (JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *this,Cycles *args)

{
  HalfCycles local_20;
  Cycles *local_18;
  Cycles *args_local;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *this_local;
  
  local_18 = args;
  args_local = (Cycles *)this;
  ClockingHint::Observer::Observer(&this->super_Observer);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_00c9dbf0
  ;
  HalfCycles::HalfCycles(&local_20,local_18);
  Motorola::ACIA::ACIA::ACIA(&this->object_,local_20,(HalfCycles)0x0);
  HalfCycles::HalfCycles(&this->time_since_update_);
  HalfCycles::HalfCycles(&this->time_until_event_);
  HalfCycles::HalfCycles(&this->time_overrun_);
  this->is_flushed_ = true;
  this->did_flush_ = false;
  this->clocking_preference_ = JustInTime;
  (this->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
  ClockingHint::Source::set_clocking_hint_observer
            (&(this->object_).super_Source,&this->super_Observer);
  return;
}

Assistant:

JustInTimeActor(Args&&... args) : object_(std::forward<Args>(args)...) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				object_.set_clocking_hint_observer(this);
			}
		}